

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

void google::protobuf::internal::VerifyVersion
               (int headerVersion,int minLibraryVersion,char *filename)

{
  string *psVar1;
  int version;
  int version_00;
  int version_01;
  int version_02;
  string local_98;
  string local_78;
  LogMessage local_58;
  
  if (0x2e10f8 < minLibraryVersion) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/common.cc"
               ,0x48);
    psVar1 = &local_58.message_;
    std::__cxx11::string::append((char *)psVar1);
    VersionString_abi_cxx11_(&local_78,(internal *)(ulong)(uint)minLibraryVersion,version);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_78._M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar1);
    VersionString_abi_cxx11_(&local_98,(internal *)0x2e10f8,version_00);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_98._M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    LogMessage::Finish(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    LogMessage::~LogMessage(&local_58);
  }
  if (headerVersion < 0x2e10f8) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/common.cc"
               ,0x53);
    psVar1 = &local_58.message_;
    std::__cxx11::string::append((char *)psVar1);
    VersionString_abi_cxx11_(&local_78,(internal *)(ulong)(uint)headerVersion,version_01);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_78._M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar1);
    VersionString_abi_cxx11_(&local_98,(internal *)0x2e10f8,version_02);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_98._M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    LogMessage::Finish(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    LogMessage::~LogMessage(&local_58);
  }
  return;
}

Assistant:

void VerifyVersion(int headerVersion,
                   int minLibraryVersion,
                   const char* filename) {
  if (GOOGLE_PROTOBUF_VERSION < minLibraryVersion) {
    // Library is too old for headers.
    GOOGLE_LOG(FATAL)
      << "This program requires version " << VersionString(minLibraryVersion)
      << " of the Protocol Buffer runtime library, but the installed version "
         "is " << VersionString(GOOGLE_PROTOBUF_VERSION) << ".  Please update "
         "your library.  If you compiled the program yourself, make sure that "
         "your headers are from the same version of Protocol Buffers as your "
         "link-time library.  (Version verification failed in \""
      << filename << "\".)";
  }
  if (headerVersion < kMinHeaderVersionForLibrary) {
    // Headers are too old for library.
    GOOGLE_LOG(FATAL)
      << "This program was compiled against version "
      << VersionString(headerVersion) << " of the Protocol Buffer runtime "
         "library, which is not compatible with the installed version ("
      << VersionString(GOOGLE_PROTOBUF_VERSION) <<  ").  Contact the program "
         "author for an update.  If you compiled the program yourself, make "
         "sure that your headers are from the same version of Protocol Buffers "
         "as your link-time library.  (Version verification failed in \""
      << filename << "\".)";
  }
}